

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<tcu::Vector<float,_4>_> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::FaceForward<4>::doExpand
          (FaceForward<4> *this,ExpandContext *param_1,ArgExprs *args)

{
  ExprP<tcu::Vector<float,_4>_> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  ExprP<tcu::Vector<float,_4>_> EVar1;
  ExprP<tcu::Vector<float,_4>_> local_80 [2];
  float local_5c;
  ExprP<float> local_58;
  ExprP<float> local_48;
  ExprP<bool> local_38;
  ExprP<tcu::Vector<float,_4>_> *local_28;
  ArgExprs *args_local;
  ExpandContext *param_1_local;
  FaceForward<4> *this_local;
  
  local_28 = in_RCX;
  args_local = args;
  param_1_local = param_1;
  this_local = this;
  dot<4>((Functions *)&local_48,in_RCX + 2,in_RCX + 1);
  local_5c = 0.0;
  constant<float>((BuiltinPrecisionTests *)&local_58,&local_5c);
  BuiltinPrecisionTests::operator<((BuiltinPrecisionTests *)&local_38,&local_48,&local_58);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)local_80,local_28);
  cond<tcu::Vector<float,4>>((BuiltinPrecisionTests *)this,&local_38,local_28,local_80);
  ExprP<tcu::Vector<float,_4>_>::~ExprP(local_80);
  ExprP<bool>::~ExprP(&local_38);
  ExprP<float>::~ExprP(&local_58);
  ExprP<float>::~ExprP(&local_48);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_4>_>.super_ExprPBase<tcu::Vector<float,_4>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>.m_state =
       extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_4>_>.super_ExprPBase<tcu::Vector<float,_4>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_4>_> *)this;
  return (ExprP<tcu::Vector<float,_4>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_4>_>.
         super_ExprPBase<tcu::Vector<float,_4>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>;
}

Assistant:

ExprP<Ret>	doExpand	(ExpandContext&, const ArgExprs& args) const
	{
		return cond(dot(args.c, args.b) < constant(0.0f), args.a, -args.a);
	}